

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

ostream * __thiscall
parser::Parser::dotStringify(Parser *this,ostream *out,Grammar *grammar,CanonicalSet *canonicalSet)

{
  long lVar1;
  pointer pSVar2;
  pointer pSVar3;
  pointer pSVar4;
  pointer pSVar5;
  ostream *poVar6;
  pointer pCVar7;
  pointer pCVar8;
  _Base_ptr p_Var9;
  undefined8 uVar10;
  ulong uVar11;
  pointer pSVar12;
  ulong uVar13;
  pointer lhs;
  ulong uVar14;
  bool bVar15;
  UniqueGrammaticSymbols uniqueGrammaticSymbols;
  Situations goToSits;
  string local_b8;
  Grammar *local_98;
  long local_90;
  TerminalNames *local_88;
  NonTerminalNames *local_80;
  _Rb_tree<parser::GrammaticSymbol,_parser::GrammaticSymbol,_std::_Identity<parser::GrammaticSymbol>,_std::less<parser::GrammaticSymbol>,_std::allocator<parser::GrammaticSymbol>_>
  local_78;
  Situations local_48;
  
  local_98 = grammar;
  std::__ostream_insert<char,std::char_traits<char>>(out,"digraph CanonicalSet {",0x16);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + (char)out);
  std::ostream::put((char)out);
  std::ostream::flush();
  if ((canonicalSet->
      super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (canonicalSet->
      super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    uVar14 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(out,"I",1);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"[label=\"",8);
      pCVar8 = (canonicalSet->
               super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>).
               _M_impl.super__Vector_impl_data._M_start;
      if (((ulong)((long)(canonicalSet->
                         super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                         )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar8 >> 5) <= uVar14)
         || (pCVar7 = (canonicalSet->
                      super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                      )._M_impl.super__Vector_impl_data._M_start,
            (ulong)((long)(canonicalSet->
                          super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar7 >> 5) <= uVar14
            )) {
LAB_00116491:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar14);
        goto LAB_001164a2;
      }
      pSVar12 = *(pointer *)
                 &pCVar8[uVar14].situations.
                  super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>._M_impl;
      while (pSVar12 !=
             pCVar7[uVar14].situations.
             super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>._M_impl.
             super__Vector_impl_data._M_finish) {
        if (pSVar12 !=
            pCVar7[uVar14].situations.
            super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>._M_impl.
            super__Vector_impl_data._M_start) {
          std::__ostream_insert<char,std::char_traits<char>>(out,"\n",1);
        }
        (*(pSVar12->super_Convolution)._vptr_Convolution[1])
                  (pSVar12,out,&this->terminalNames,&this->nonTerminalNames);
        pSVar12 = pSVar12 + 1;
        pCVar7 = (canonicalSet->
                 super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(canonicalSet->
                          super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar7 >> 5) <= uVar14
           ) goto LAB_00116491;
      }
      std::__ostream_insert<char,std::char_traits<char>>(out,"\"]\n",3);
      uVar14 = uVar14 + 1;
    } while (uVar14 < (ulong)((long)(canonicalSet->
                                    super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(canonicalSet->
                                    super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  pCVar8 = (canonicalSet->
           super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((canonicalSet->
      super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>)._M_impl.
      super__Vector_impl_data._M_finish != pCVar8) {
    local_80 = &this->nonTerminalNames;
    local_88 = &this->terminalNames;
    uVar14 = 0;
    do {
      local_78._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_78._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_78._M_impl.super__Rb_tree_header._M_header;
      local_78._M_impl.super__Rb_tree_header._M_node_count = 0;
      pCVar7 = (canonicalSet->
               super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>).
               _M_impl.super__Vector_impl_data._M_start;
      local_78._M_impl.super__Rb_tree_header._M_header._M_right =
           local_78._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((ulong)((long)(canonicalSet->
                        super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar7 >> 5) <= uVar14)
      {
LAB_001164a2:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar14);
LAB_001164b3:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar14);
LAB_001164c4:
        uVar10 = std::__throw_out_of_range_fmt
                           (
                           "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           );
        std::
        _Rb_tree<parser::GrammaticSymbol,_parser::GrammaticSymbol,_std::_Identity<parser::GrammaticSymbol>,_std::less<parser::GrammaticSymbol>,_std::allocator<parser::GrammaticSymbol>_>
        ::~_Rb_tree(&local_78);
        _Unwind_Resume(uVar10);
      }
      pSVar12 = pCVar8[uVar14].situations.
                super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>._M_impl.
                super__Vector_impl_data._M_start;
      while (pSVar12 !=
             pCVar7[uVar14].situations.
             super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>._M_impl.
             super__Vector_impl_data._M_finish) {
        lVar1 = *(long *)&(pSVar12->super_Convolution).body.
                          super__Vector_base<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>
                          ._M_impl.super__Vector_impl_data;
        uVar11 = (long)(pSVar12->super_Convolution).body.
                       super__Vector_base<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>
                       ._M_impl.super__Vector_impl_data._M_finish - lVar1 >> 3;
        uVar13 = pSVar12->point;
        if (uVar11 != uVar13) {
          if (uVar11 <= uVar13) goto LAB_001164c4;
          std::
          _Rb_tree<parser::GrammaticSymbol,parser::GrammaticSymbol,std::_Identity<parser::GrammaticSymbol>,std::less<parser::GrammaticSymbol>,std::allocator<parser::GrammaticSymbol>>
          ::_M_insert_unique<parser::GrammaticSymbol_const&>
                    ((_Rb_tree<parser::GrammaticSymbol,parser::GrammaticSymbol,std::_Identity<parser::GrammaticSymbol>,std::less<parser::GrammaticSymbol>,std::allocator<parser::GrammaticSymbol>>
                      *)&local_78,(GrammaticSymbol *)(lVar1 + uVar13 * 8));
        }
        pCVar7 = (canonicalSet->
                 super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        pSVar12 = pSVar12 + 1;
        if ((ulong)((long)(canonicalSet->
                          super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar7 >> 5) <= uVar14
           ) goto LAB_001164a2;
      }
      p_Var9 = local_78._M_impl.super__Rb_tree_header._M_header._M_left;
      local_90 = uVar14 * 0x20;
      if ((_Rb_tree_header *)local_78._M_impl.super__Rb_tree_header._M_header._M_left !=
          &local_78._M_impl.super__Rb_tree_header) {
        do {
          pCVar8 = (canonicalSet->
                   super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(canonicalSet->
                            super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar8 >> 5) <=
              uVar14) goto LAB_001164b3;
          goTo(&local_48,this,local_98,
               (Situations *)
               ((long)&(pCVar8->situations).
                       super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>.
                       _M_impl.super__Vector_impl_data._M_start + local_90),
               (GrammaticSymbol *)(p_Var9 + 1));
          pCVar8 = (canonicalSet->
                   super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if ((canonicalSet->
              super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>).
              _M_impl.super__Vector_impl_data._M_finish != pCVar8) {
            uVar13 = 0;
            do {
              pSVar5 = local_48.
                       super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
              pSVar2 = local_48.
                       super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              pSVar12 = pCVar8[uVar13].situations.
                        super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              if ((long)local_48.
                        super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_48.
                        super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>.
                        _M_impl.super__Vector_impl_data._M_start ==
                  (long)pCVar8[uVar13].situations.
                        super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)pSVar12) {
                bVar15 = local_48.
                         super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>.
                         _M_impl.super__Vector_impl_data._M_start ==
                         local_48.
                         super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
                if (bVar15) {
LAB_001162e3:
                  if (bVar15) {
                    std::__ostream_insert<char,std::char_traits<char>>(out,"I",1);
                    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)out);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar6," -> ",4);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"I",1);
                    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar6," [label=\"",9);
                    if (p_Var9[1].field_0x4 == '\x01') {
                      lexer::terminalName(&local_b8,p_Var9[1]._M_color,local_88);
                    }
                    else {
                      nonTerminalName(&local_b8,p_Var9[1]._M_color,local_80);
                    }
                    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                       (poVar6,local_b8._M_dataplus._M_p,local_b8._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"]",2);
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
                    std::ostream::put((char)poVar6);
                    std::ostream::flush();
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                      operator_delete(local_b8._M_dataplus._M_p,
                                      local_b8.field_2._M_allocated_capacity + 1);
                    }
                  }
                }
                else {
                  bVar15 = operator==(&(local_48.
                                        super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                       super_Convolution,&pSVar12->super_Convolution);
                  if (bVar15 && pSVar2->point == pSVar12->point) {
                    do {
                      lhs = pSVar2 + 1;
                      bVar15 = lhs == pSVar5;
                      if (bVar15) goto LAB_001162e3;
                      bVar15 = operator==(&lhs->super_Convolution,&pSVar12[1].super_Convolution);
                      pSVar4 = pSVar12 + 1;
                      pSVar3 = pSVar2 + 1;
                      pSVar2 = lhs;
                      pSVar12 = pSVar12 + 1;
                    } while (bVar15 && (_func_int **)pSVar3->point ==
                                       ((Convolution *)&pSVar4->point)->_vptr_Convolution);
                  }
                }
              }
              uVar13 = uVar13 + 1;
              pCVar8 = (canonicalSet->
                       super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                       )._M_impl.super__Vector_impl_data._M_start;
            } while (uVar13 < (ulong)((long)(canonicalSet->
                                            super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                                            )._M_impl.super__Vector_impl_data._M_finish -
                                      (long)pCVar8 >> 5));
          }
          std::vector<parser::Situation,_std::allocator<parser::Situation>_>::~vector(&local_48);
          p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
        } while ((_Rb_tree_header *)p_Var9 != &local_78._M_impl.super__Rb_tree_header);
      }
      std::
      _Rb_tree<parser::GrammaticSymbol,_parser::GrammaticSymbol,_std::_Identity<parser::GrammaticSymbol>,_std::less<parser::GrammaticSymbol>,_std::allocator<parser::GrammaticSymbol>_>
      ::~_Rb_tree(&local_78);
      uVar14 = uVar14 + 1;
      pCVar8 = (canonicalSet->
               super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>).
               _M_impl.super__Vector_impl_data._M_start;
    } while (uVar14 < (ulong)((long)(canonicalSet->
                                    super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar8 >> 5)
            );
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"}",1);
  return out;
}

Assistant:

std::ostream& dotStringify(std::ostream& out, Grammar const& grammar,
                                   CanonicalSet const& canonicalSet) {
            out << "digraph CanonicalSet {" << std::endl;

            for (size_t i = 0; i < canonicalSet.size(); ++i) {
                out << "I" << i << "[label=\"";
                for_each_c(Situations, canonicalSet.at(i).situations, sit) {
                    if (sit != canonicalSet.at(i).situations.begin()) out  << "\n";
                    sit->stringify(out, terminalNames, nonTerminalNames);
                }
                out << "\"]\n";
            }

            for (size_t i = 0; i < canonicalSet.size(); ++i) {
                UniqueGrammaticSymbols uniqueGrammaticSymbols;
                for_each_c(Situations, canonicalSet.at(i).situations, situation) {
                    if (situation->body.size() == situation->point)
                        continue;
                    uniqueGrammaticSymbols.insert(situation->body.at(situation->point));
                }

                for_each(UniqueGrammaticSymbols, uniqueGrammaticSymbols, symbol) {
                    Situations goToSits = goTo(grammar, canonicalSet.at(i).situations, *symbol);

                    for (size_t j = 0; j < canonicalSet.size(); ++j) {
                        if (goToSits == canonicalSet.at(j).situations) {
                            out << "I" << i << " -> " << "I" << j << " [label=\""
                              << (symbol->isTerminal ? lexer::terminalName(symbol->value, terminalNames)
                                                     : nonTerminalName(symbol->value, nonTerminalNames)) << "\"]" << std::endl;
                        }
                    }
                }
            }
            out << "}";
            return out;
        }